

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O3

char * strtoken(char *src,char *dst,int size)

{
  char *__src;
  int iVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  
  lVar2 = 0;
  do {
    bVar4 = src[lVar2];
    if (bVar4 < 10) {
      if (bVar4 != 9) break;
    }
    else if (bVar4 != 0x20) {
      if (bVar4 != 10) goto LAB_001106ed;
      goto LAB_0011071b;
    }
    lVar2 = lVar2 + 1;
  } while( true );
  if (bVar4 == 0) {
LAB_0011071b:
    pcVar9 = (char *)0x0;
  }
  else {
LAB_001106ed:
    __src = src + lVar2;
    lVar3 = 0;
    while ((bVar4 != 0 && (bVar4 != 10))) {
      if (bVar4 == 0x20) {
        lVar8 = lVar3 + lVar2 + 1;
        goto LAB_00110734;
      }
      lVar8 = lVar2 + 1 + lVar3;
      lVar3 = lVar3 + 1;
      bVar4 = src[lVar8];
    }
    lVar8 = lVar3 + lVar2;
LAB_00110734:
    pcVar9 = src + lVar8;
    pcVar7 = __src;
    if (lVar3 != 1) {
      lVar8 = -(lVar3 + -1);
      pcVar6 = src + lVar3 + lVar2;
      do {
        pcVar6 = pcVar6 + -1;
        if ((*pcVar6 != ' ') && (pcVar7 = pcVar6, *pcVar6 != '\t')) break;
        lVar8 = lVar8 + 1;
        pcVar7 = __src;
      } while (lVar8 != 0);
    }
    iVar5 = (((int)pcVar7 - (int)src) - (int)lVar2) + 1;
    iVar1 = size + -1;
    if (iVar5 < size) {
      iVar1 = iVar5;
    }
    if (size < 1) {
      iVar1 = iVar5;
    }
    strncpy(dst,__src,(long)iVar1);
    dst[iVar1] = '\0';
  }
  return pcVar9;
}

Assistant:

char *strtoken(char *src, char *dst, int size)
{
    char *p, *st, *ed;
    int  len = 0;

    // l-trim
    p = src;

    while(TRUE)
    {
        if((*p == '\n') || (*p == 0)) return NULL; /* value is not exists */
        if((*p != ' ') && (*p != '\t')) break;
        p++;
    }

    st = p;
    while(TRUE)
    {
        ed = p;
        if(*p == ' ') {
            p++;
            break;
        }
        if((*p == '\n') || (*p == 0)) break;
        p++;
    }

    // r-trim
    while(TRUE)
    {
        ed--;
        if(st == ed) break;
        if((*ed != ' ') && (*ed != '\t')) break;
    }

    len = (int)(ed - st + 1);
    if((size > 0) && (len >= size)) len = size - 1;

    strncpy(dst, st, len);
    dst[len]=0;

    return p;
}